

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abstractscrollarea.cpp
# Opt level: O0

void __thiscall
QtMWidgets::AbstractScrollAreaPrivate::scrollContentsBy
          (AbstractScrollAreaPrivate *this,int dx,int dy)

{
  int iVar1;
  QPoint local_20;
  int local_18;
  int local_14;
  int dy_local;
  int dx_local;
  AbstractScrollAreaPrivate *this_local;
  
  local_18 = dy;
  local_14 = dx;
  _dy_local = this;
  QPoint::QPoint(&local_20,dx,dy);
  QPoint::operator-=(&this->topLeftCorner,&local_20);
  if (local_14 != 0) {
    this->horIndicator->needPaint = true;
    iVar1 = QColor::alpha();
    this->horIndicator->alpha = iVar1;
    this->horIndicator->animate = false;
    iVar1 = QColor::alpha();
    this->vertIndicator->alpha = iVar1;
    this->vertIndicator->animate = false;
    QTimer::stop();
    QWidget::raise();
  }
  if (local_18 != 0) {
    this->vertIndicator->needPaint = true;
    iVar1 = QColor::alpha();
    this->vertIndicator->alpha = iVar1;
    this->vertIndicator->animate = false;
    iVar1 = QColor::alpha();
    this->horIndicator->alpha = iVar1;
    this->horIndicator->animate = false;
    QTimer::stop();
    QWidget::raise();
  }
  makeBlurEffectIfNeeded(this);
  calcIndicators(this);
  QWidget::update();
  QWidget::update();
  QWidget::update();
  return;
}

Assistant:

void
AbstractScrollAreaPrivate::scrollContentsBy( int dx, int dy )
{
	topLeftCorner -= QPoint( dx, dy );

	if( dx != 0 )
	{
		horIndicator->needPaint = true;
		horIndicator->alpha = horIndicator->color.alpha();
		horIndicator->animate = false;
		vertIndicator->alpha = vertIndicator->color.alpha();
		vertIndicator->animate = false;
		animationTimer->stop();
		horIndicator->raise();
	}

	if( dy != 0 )
	{
		vertIndicator->needPaint = true;
		vertIndicator->alpha = vertIndicator->color.alpha();
		vertIndicator->animate = false;
		horIndicator->alpha = horIndicator->color.alpha();
		horIndicator->animate = false;
		animationTimer->stop();
		vertIndicator->raise();
	}

	makeBlurEffectIfNeeded();

	calcIndicators();

	q->update();
	horIndicator->update();
	vertIndicator->update();
}